

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O0

void read_instructions(wasm_reader *wr,vec *instructions)

{
  instruction iVar1;
  undefined8 extraout_RDX;
  bool local_39;
  undefined7 uStack_37;
  undefined8 local_28;
  instruction inst;
  vec *instructions_local;
  wasm_reader *wr_local;
  
  inst.arg = instructions;
  init_vec(instructions,0x10);
  do {
    iVar1.op_code = (*(wr->wr_op).read_instruction)(wr);
    local_28 = CONCAT71(uStack_37,iVar1.op_code);
    inst._0_8_ = extraout_RDX;
    (**(code **)((long)inst.arg + 0x20))(inst.arg,&local_28);
    local_39 = (char)local_28 != '\v' && (char)local_28 != '\x05';
  } while (local_39);
  return;
}

Assistant:

void read_instructions(wasm_reader *wr, vec *instructions) {
    init_vec(instructions, sizeof(instruction));
    instruction inst;
    do {
        inst = wr->wr_op.read_instruction(wr);
        instructions->append(instructions, &inst);
    } while (inst.op_code != End_ && inst.op_code != Else_);
}